

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::_::ForkHubBase::fire(ForkHubBase *this)

{
  char *pcVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *pEVar8;
  Event *extraout_RDX_01;
  char *in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar9;
  NullableValue<kj::Exception> exception;
  Runnable local_2f0;
  Exception local_2e8;
  Maybe<kj::Exception> local_190;
  
  (**(code **)(**(long **)(in_RSI + 0x40) + 0x10))
            (*(long **)(in_RSI + 0x40),*(undefined8 *)(in_RSI + 0x48));
  local_2f0._vptr_Runnable = (_func_int **)&PTR_run_004490e0;
  local_2e8.ownFile.content.ptr = in_RSI;
  runCatchingExceptions(&local_190,&local_2f0);
  uVar7 = local_190.ptr.field_1.value.context.ptr.ptr;
  uVar6 = local_190.ptr.field_1.value.description.content.size_;
  uVar5 = local_190.ptr.field_1.value.description.content.ptr;
  uVar4 = local_190.ptr.field_1.value.ownFile.content.size_;
  uVar3 = local_190.ptr.field_1.value.ownFile.content.ptr;
  local_2f0._vptr_Runnable._0_1_ = local_190.ptr.isSet;
  pEVar8 = extraout_RDX;
  if (local_190.ptr.isSet == true) {
    local_2e8.ownFile.content.ptr = local_190.ptr.field_1.value.ownFile.content.ptr;
    local_2e8.ownFile.content.size_ = local_190.ptr.field_1.value.ownFile.content.size_;
    local_2e8.ownFile.content.disposer = local_190.ptr.field_1.value.ownFile.content.disposer;
    local_190.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_190.ptr.field_1.value.ownFile.content.size_ = 0;
    local_2e8.file = local_190.ptr.field_1.value.file;
    local_2e8.line = local_190.ptr.field_1.value.line;
    local_2e8.type = local_190.ptr.field_1.value.type;
    local_2e8.description.content.ptr = local_190.ptr.field_1.value.description.content.ptr;
    local_2e8.description.content.size_ = local_190.ptr.field_1.value.description.content.size_;
    local_2e8.description.content.disposer =
         local_190.ptr.field_1.value.description.content.disposer;
    local_190.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_190.ptr.field_1.value.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_190.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.ptr = local_190.ptr.field_1.value.context.ptr.ptr;
    local_190.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,(void *)((long)&local_190.ptr.field_1 + 0x50),0x104);
    Exception::~Exception(&local_190.ptr.field_1.value);
    pcVar1 = *(char **)(in_RSI + 0x48);
    if (*pcVar1 == '\0') {
      *(undefined8 *)(pcVar1 + 8) = uVar3;
      *(undefined8 *)(pcVar1 + 0x10) = uVar4;
      *(ArrayDisposer **)(pcVar1 + 0x18) = local_190.ptr.field_1.value.ownFile.content.disposer;
      local_2e8.ownFile.content.ptr = (char *)0x0;
      local_2e8.ownFile.content.size_ = 0;
      *(char **)(pcVar1 + 0x20) = local_2e8.file;
      *(undefined8 *)(pcVar1 + 0x28) = local_2e8._32_8_;
      *(undefined8 *)(pcVar1 + 0x30) = uVar5;
      *(undefined8 *)(pcVar1 + 0x38) = uVar6;
      *(ArrayDisposer **)(pcVar1 + 0x40) = local_190.ptr.field_1.value.description.content.disposer;
      local_2e8.description.content.ptr = (char *)0x0;
      local_2e8.description.content.size_ = 0;
      *(Disposer **)(pcVar1 + 0x48) = local_190.ptr.field_1.value.context.ptr.disposer;
      *(undefined8 *)(pcVar1 + 0x50) = uVar7;
      local_2e8.context.ptr.ptr = (Context *)0x0;
      memcpy(pcVar1 + 0x58,local_2e8.trace,0x104);
      *pcVar1 = '\x01';
    }
    Exception::~Exception(&local_2e8);
    pEVar8 = extraout_RDX_00;
  }
  for (lVar2 = *(long *)(in_RSI + 0x50); lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x20)) {
    PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(lVar2 + 8));
    **(undefined8 **)(lVar2 + 0x28) = 0;
    *(undefined8 *)(lVar2 + 0x28) = 0;
    pEVar8 = extraout_RDX_01;
  }
  **(undefined8 **)(in_RSI + 0x58) = 0;
  in_RSI[0x58] = '\0';
  in_RSI[0x59] = '\0';
  in_RSI[0x5a] = '\0';
  in_RSI[0x5b] = '\0';
  in_RSI[0x5c] = '\0';
  in_RSI[0x5d] = '\0';
  in_RSI[0x5e] = '\0';
  in_RSI[0x5f] = '\0';
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(this->super_Refcounted).refcount = 0;
  MVar9.ptr.ptr = pEVar8;
  MVar9.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar9.ptr;
}

Assistant:

Maybe<Own<Event>> ForkHubBase::fire() {
  // Dependency is ready.  Fetch its result and then delete the node.
  inner->get(resultRef);
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
    inner = nullptr;
  })) {
    resultRef.addException(kj::mv(*exception));
  }

  for (auto branch = headBranch; branch != nullptr; branch = branch->next) {
    branch->hubReady();
    *branch->prevPtr = nullptr;
    branch->prevPtr = nullptr;
  }
  *tailBranch = nullptr;

  // Indicate that the list is no longer active.
  tailBranch = nullptr;

  return nullptr;
}